

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

u8 __thiscall moira::Moira::readFC(Moira *this)

{
  u8 uVar1;
  byte bVar2;
  Moira *this_local;
  
  uVar1 = this->fcSource;
  if (uVar1 == '\0') {
    bVar2 = 0;
    if (((this->reg).sr.s & 1U) != 0) {
      bVar2 = 4;
    }
    this_local._7_1_ = bVar2 | this->fcl;
  }
  else if (uVar1 == '\x01') {
    this_local._7_1_ = (byte)(this->reg).sfc;
  }
  else {
    if (uVar1 != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                    ,0x326,"u8 moira::Moira::readFC() const");
    }
    this_local._7_1_ = (byte)(this->reg).dfc;
  }
  return this_local._7_1_;
}

Assistant:

u8
Moira::readFC() const
{
    switch (fcSource) {

        case 0: return u8((reg.sr.s ? 4 : 0) | fcl);
        case 1: return u8(reg.sfc);
        case 2: return u8(reg.dfc);

        default:
            fatalError;
    }
}